

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O0

TypedAttribute<Imath_3_1::Vec3<double>_> *
Imf_3_3::TypedAttribute<Imath_3_1::Vec3<double>_>::cast(Attribute *attribute)

{
  TypedAttribute<Imath_3_1::Vec3<double>_> *this;
  char *text;
  long in_RDI;
  TypedAttribute<Imath_3_1::Vec3<double>_> *t;
  
  if (in_RDI == 0) {
    this = (TypedAttribute<Imath_3_1::Vec3<double>_> *)0x0;
  }
  else {
    this = (TypedAttribute<Imath_3_1::Vec3<double>_> *)
           __dynamic_cast(in_RDI,&Attribute::typeinfo,
                          &TypedAttribute<Imath_3_1::Vec3<double>>::typeinfo,0);
  }
  if (this == (TypedAttribute<Imath_3_1::Vec3<double>_> *)0x0) {
    text = (char *)__cxa_allocate_exception(0x48);
    Iex_3_3::TypeExc::TypeExc((TypeExc *)this,text);
    __cxa_throw(text,&Iex_3_3::TypeExc::typeinfo,Iex_3_3::TypeExc::~TypeExc);
  }
  return this;
}

Assistant:

const TypedAttribute<T>*
TypedAttribute<T>::cast (const Attribute* attribute)
{
    const TypedAttribute<T>* t =
        dynamic_cast<const TypedAttribute<T>*> (attribute);

    if (t == 0) throw IEX_NAMESPACE::TypeExc ("Unexpected attribute type.");

    return t;
}